

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev1.c
# Opt level: O1

LispPTR N_OP_putbasen(LispPTR base,LispPTR tos,int n)

{
  if ((tos & 0xfff0000) == 0xe0000) {
    *(short *)((ulong)(Lisp_world + (n + (base & 0xfffffff))) ^ 2) = (short)tos;
    return base & 0xfffffff;
  }
  MachineState.tosvalue = tos;
  MachineState.errorexit = 1;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_putbasen(LispPTR base, LispPTR tos, int n) {
  base = POINTERMASK & base;
  if ((SEGMASK & tos) != S_POSITIVE) {
    ERROR_EXIT(tos);
  } else {
    GETWORD(NativeAligned2FromLAddr(base + n)) = GetLoWord(tos);
    return (base);
  }
}